

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Appearance_PDU::SetAppearanceAudioFlag(Appearance_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  short sVar2;
  
  if ((((this->m_AppearanceFlag2Union).m_ui8Flag & 2) == 0) == F) {
    (this->m_AppearanceFlag2Union).m_ui8Flag =
         (this->m_AppearanceFlag2Union).m_ui8Flag & 0xfd | F * '\x02';
    sVar2 = -4;
    if (F) {
      sVar2 = 4;
      if (-1 < (char)(this->m_AppearanceFlag1Union).m_ui8Flag) {
        (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag | 0x80;
        pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
        *pKVar1 = *pKVar1 + 1;
      }
    }
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + sVar2;
  }
  return;
}

Assistant:

void Appearance_PDU::SetAppearanceAudioFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag2Union.m_ui8Audio )return;

    m_AppearanceFlag2Union.m_ui8Audio = F;

    if( F )
    {
        SetFlag2Flag( F );
        m_ui16PDULength += EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
}